

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5PoslistFilterCallback(Fts5Index *pUnused,void *pContext,u8 *pChunk,int nChunk)

{
  u8 uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  u8 *puVar5;
  ulong uVar6;
  uint uVar7;
  long in_FS_OFFSET;
  uint local_40;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < nChunk) {
    local_40 = 0;
    uVar6 = 0;
    if (*(int *)((long)pContext + 0x10) == 2) {
      local_3c = (uint)*pChunk;
      if ((char)*pChunk < '\0') {
        uVar2 = sqlite3Fts5GetVarint32(pChunk,&local_3c);
        uVar6 = (ulong)uVar2;
      }
      else {
        uVar6 = 1;
      }
      iVar3 = fts5IndexColsetTest(*(Fts5Colset **)((long)pContext + 8),local_3c);
      if (iVar3 == 0) {
        *(undefined4 *)((long)pContext + 0x10) = 0;
      }
      else {
        *(undefined4 *)((long)pContext + 0x10) = 1;
        *(undefined1 *)(**pContext + (long)(int)(*pContext)[1]) = 1;
        *(int *)(*pContext + 8) = *(int *)(*pContext + 8) + 1;
      }
    }
    do {
      while( true ) {
        uVar2 = (uint)uVar6;
        lVar4 = (long)(int)uVar2;
        if ((nChunk <= (int)uVar2) || (pChunk[lVar4] == '\x01')) break;
        puVar5 = pChunk + lVar4;
        do {
          uVar6 = (ulong)((int)uVar6 + 1);
          uVar1 = *puVar5;
          puVar5 = puVar5 + 1;
        } while ((char)uVar1 < '\0');
      }
      if (*(int *)((long)pContext + 0x10) != 0) {
        memcpy((void *)((long)(int)(*pContext)[1] + **pContext),pChunk + (int)local_40,
               (long)(int)(uVar2 - local_40));
        *(int *)(*pContext + 8) = *(int *)(*pContext + 8) + (uVar2 - local_40);
      }
      if ((int)uVar2 < nChunk) {
        uVar6 = lVar4 + 1;
        if ((int)uVar6 < nChunk) {
          local_3c = (uint)pChunk[uVar6];
          if ((char)pChunk[uVar6] < '\0') {
            iVar3 = sqlite3Fts5GetVarint32(pChunk + uVar6,&local_3c);
            uVar7 = iVar3 + (int)uVar6;
          }
          else {
            uVar7 = uVar2 + 2;
          }
          uVar6 = (ulong)uVar7;
          iVar3 = fts5IndexColsetTest(*(Fts5Colset **)((long)pContext + 8),local_3c);
          *(int *)((long)pContext + 0x10) = iVar3;
          if (iVar3 != 0) {
            memcpy((void *)((long)(int)(*pContext)[1] + **pContext),pChunk + lVar4,
                   (long)(int)(uVar7 - uVar2));
            *(int *)(*pContext + 8) = *(int *)(*pContext + 8) + (uVar7 - uVar2);
            uVar2 = uVar7;
          }
        }
        else {
          *(undefined4 *)((long)pContext + 0x10) = 2;
        }
        uVar6 = uVar6 & 0xffffffff;
        local_40 = uVar2;
      }
    } while ((int)uVar6 < nChunk);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts5PoslistFilterCallback(
  Fts5Index *pUnused,
  void *pContext,
  const u8 *pChunk, int nChunk
){
  PoslistCallbackCtx *pCtx = (PoslistCallbackCtx*)pContext;
  UNUSED_PARAM(pUnused);
  assert_nc( nChunk>=0 );
  if( nChunk>0 ){
    /* Search through to find the first varint with value 1. This is the
    ** start of the next columns hits. */
    int i = 0;
    int iStart = 0;

    if( pCtx->eState==2 ){
      int iCol;
      fts5FastGetVarint32(pChunk, i, iCol);
      if( fts5IndexColsetTest(pCtx->pColset, iCol) ){
        pCtx->eState = 1;
        fts5BufferSafeAppendVarint(pCtx->pBuf, 1);
      }else{
        pCtx->eState = 0;
      }
    }

    do {
      while( i<nChunk && pChunk[i]!=0x01 ){
        while( pChunk[i] & 0x80 ) i++;
        i++;
      }
      if( pCtx->eState ){
        fts5BufferSafeAppendBlob(pCtx->pBuf, &pChunk[iStart], i-iStart);
      }
      if( i<nChunk ){
        int iCol;
        iStart = i;
        i++;
        if( i>=nChunk ){
          pCtx->eState = 2;
        }else{
          fts5FastGetVarint32(pChunk, i, iCol);
          pCtx->eState = fts5IndexColsetTest(pCtx->pColset, iCol);
          if( pCtx->eState ){
            fts5BufferSafeAppendBlob(pCtx->pBuf, &pChunk[iStart], i-iStart);
            iStart = i;
          }
        }
      }
    }while( i<nChunk );
  }
}